

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O3

void idwpt_sym(wpt_object wt,double *cA,int len_cA,double *cD,double *X)

{
  long lVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  
  if (0 < len_cA) {
    iVar5 = *(int *)(wt->entropy + 0x12) + *(int *)(wt->entropy + 0xe);
    iVar3 = *(int *)(wt->entropy + 0x12) + *(int *)(wt->entropy + 0xe) + 3;
    if (-1 < iVar5) {
      iVar3 = iVar5;
    }
    lVar9 = -1;
    lVar8 = -2;
    uVar4 = 0;
    do {
      X[lVar8 + 2] = 0.0;
      lVar8 = lVar8 + 2;
      X[lVar9 + 2] = 0.0;
      lVar9 = lVar9 + 2;
      if (3 < iVar5) {
        dVar10 = 0.0;
        lVar6 = 4;
        lVar7 = 0;
        dVar11 = 0.0;
        do {
          if ((uint)((int)uVar4 + (int)lVar7) < (uint)len_cA) {
            lVar1 = *(long *)wt->length;
            lVar2 = *(long *)(wt->length + 2);
            dVar11 = dVar11 + *(double *)(lVar1 + -8 + lVar6 * 2) * cA[lVar7] +
                              *(double *)(lVar2 + -8 + lVar6 * 2) * cD[lVar7];
            X[lVar8] = dVar11;
            dVar10 = dVar10 + *(double *)(lVar1 + lVar6 * 2) * cA[lVar7] +
                              *(double *)(lVar2 + lVar6 * 2) * cD[lVar7];
            X[lVar9] = dVar10;
          }
          lVar7 = lVar7 + -1;
          lVar6 = lVar6 + 8;
        } while (-lVar7 != (ulong)(uint)(iVar3 >> 2));
      }
      uVar4 = uVar4 + 1;
      cD = cD + 1;
      cA = cA + 1;
    } while (uVar4 != (uint)len_cA);
  }
  return;
}

Assistant:

static void idwpt_sym(wpt_object wt, double *cA, int len_cA, double *cD, double *X) {
	int len_avg, i, l, m, n, t, v;

	len_avg = (wt->wave->lpr_len + wt->wave->hpr_len) / 2;
	m = -2;
	n = -1;

	for (v = 0; v < len_cA; ++v) {
		i = v;
		m += 2;
		n += 2;
		X[m] = 0.0;
		X[n] = 0.0;
		for (l = 0; l < len_avg / 2; ++l) {
			t = 2 * l;
			if ((i - l) >= 0 && (i - l) < len_cA) {
				X[m] += wt->wave->lpr[t] * cA[i - l] + wt->wave->hpr[t] * cD[i - l];
				X[n] += wt->wave->lpr[t + 1] * cA[i - l] + wt->wave->hpr[t + 1] * cD[i - l];
			}
		}
	}
}